

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O1

string * UrlDecode_abi_cxx11_(string *__return_storage_ptr__,string_view url_encoded)

{
  char __c;
  char *pcVar1;
  ulong uVar2;
  size_type __res;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<unsigned_int> _Var3;
  uint decoded_value;
  uint local_3c;
  long local_38;
  
  pcVar1 = url_encoded._M_str;
  __res = url_encoded._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,__res);
  if (__res != 0) {
    uVar2 = 0;
    do {
      __c = pcVar1[uVar2];
      if ((__c == '%') && (uVar2 + 2 < __res)) {
        local_3c = 0;
        _Var3 = std::from_chars<unsigned_int>(pcVar1 + uVar2 + 1,pcVar1 + uVar2 + 3,&local_3c,0x10);
        if (_Var3.ptr != pcVar1 + uVar2 + 3 || _Var3.ec != 0) goto LAB_0034a458;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,(char)local_3c);
        uVar2 = uVar2 + 2;
      }
      else {
LAB_0034a458:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,__c);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < __res);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string UrlDecode(std::string_view url_encoded)
{
    std::string res;
    res.reserve(url_encoded.size());

    for (size_t i = 0; i < url_encoded.size(); ++i) {
        char c = url_encoded[i];
        // Special handling for percent which should be followed by two hex digits
        // representing an octet values, see RFC 3986, Section 2.1 Percent-Encoding
        if (c == '%' && i + 2 < url_encoded.size()) {
            unsigned int decoded_value{0};
            auto [p, ec] = std::from_chars(url_encoded.data() + i + 1, url_encoded.data() + i + 3, decoded_value, 16);

            // Only if there is no error and the pointer is set to the end of
            // the string, we can be sure both characters were valid hex
            if (ec == std::errc{} && p == url_encoded.data() + i + 3) {
                res += static_cast<char>(decoded_value);
                // Next two characters are part of the percent encoding
                i += 2;
                continue;
            }
            // In case of invalid percent encoding, add the '%' and continue
        }
        res += c;
    }

    return res;
}